

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.h
# Opt level: O0

VisionFeaturePrint_Objects * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_objects(VisionFeaturePrint *this)

{
  bool bVar1;
  VisionFeaturePrint_Objects *this_00;
  VisionFeaturePrint *this_local;
  
  bVar1 = has_objects(this);
  if (!bVar1) {
    clear_VisionFeaturePrintType(this);
    set_has_objects(this);
    this_00 = (VisionFeaturePrint_Objects *)operator_new(0x30);
    VisionFeaturePrint_Objects::VisionFeaturePrint_Objects(this_00);
    (this->VisionFeaturePrintType_).objects_ = this_00;
  }
  return (VisionFeaturePrint_Objects *)(this->VisionFeaturePrintType_).scene_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects* VisionFeaturePrint::mutable_objects() {
  if (!has_objects()) {
    clear_VisionFeaturePrintType();
    set_has_objects();
    VisionFeaturePrintType_.objects_ = new ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.VisionFeaturePrint.objects)
  return VisionFeaturePrintType_.objects_;
}